

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int __thiscall ncnn::Reduction::load_param(Reduction *this,ParamDict *pd)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  int iVar3;
  float fVar4;
  Mat local_a8;
  Mat local_68;
  
  iVar3 = ParamDict::get(pd,0,0);
  this->operation = iVar3;
  iVar3 = ParamDict::get(pd,1,1);
  this->reduce_all = iVar3;
  fVar4 = ParamDict::get(pd,2,1.0);
  this->coeff = fVar4;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&local_a8,pd,3,&local_68);
  if (&this->axes != &local_a8) {
    piVar1 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->axes).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = (this->axes).data;
        pAVar2 = (this->axes).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->axes).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->axes).elemsize + 4) = 0;
    (this->axes).data = (void *)0x0;
    (this->axes).refcount = (int *)0x0;
    (this->axes).dims = 0;
    (this->axes).w = 0;
    (this->axes).h = 0;
    (this->axes).c = 0;
    (this->axes).cstep = 0;
    (this->axes).data = local_a8.data;
    (this->axes).refcount = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    (this->axes).elemsize = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
    (this->axes).elempack = local_a8.elempack;
    (this->axes).allocator = local_a8.allocator;
    (this->axes).dims = local_a8.dims;
    (this->axes).w = local_a8.w;
    (this->axes).h = local_a8.h;
    (this->axes).c = local_a8.c;
    (this->axes).cstep = local_a8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_a8.allocator + 0x18))();
      }
    }
  }
  local_a8.elemsize._0_4_ = 0;
  local_a8.elemsize._4_4_ = 0;
  local_a8.elempack = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.c = 0;
  local_a8.cstep = 0;
  piVar1 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  iVar3 = ParamDict::get(pd,4,0);
  this->keepdims = iVar3;
  return 0;
}

Assistant:

int Reduction::load_param(const ParamDict& pd)
{
    operation = pd.get(0, 0);
    reduce_all = pd.get(1, 1);
    coeff = pd.get(2, 1.f);
    axes = pd.get(3, Mat());
    keepdims = pd.get(4, 0);

    return 0;
}